

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

void __thiscall duckdb_shell::ShellState::ResetOutput(ShellState *this)

{
  FILE *__stream;
  int iVar1;
  char *__command;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if (((this->outfile)._M_string_length < 2) || (*(this->outfile)._M_dataplus._M_p != '|')) {
    __stream = (FILE *)this->out;
    if ((__stream != (FILE *)0x0) && ((_stdout != __stream && (_stderr != __stream)))) {
      fclose(__stream);
    }
    if (this->doXdgOpen != '\0') {
      __command = duckdb_shell_sqlite3_mprintf("%s %s","xdg-open",this->zTempFile);
      iVar1 = system(__command);
      if (iVar1 == 0) {
        duckdb_shell_sqlite3_sleep(2000);
      }
      else {
        fprintf(_stderr,"Failed: [%s]\n",__command);
      }
      duckdb_shell_sqlite3_free(__command);
      this->mode = this->modePrior;
      this->shellFlgs = this->priorShFlgs;
      std::__cxx11::string::_M_assign((string *)&this->colSeparator);
      std::__cxx11::string::_M_assign((string *)&this->rowSeparator);
      this->doXdgOpen = '\0';
    }
  }
  else {
    pclose((FILE *)this->out);
  }
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::__cxx11::string::operator=((string *)&this->outfile,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  this->out = (FILE *)_stdout;
  stdout_is_console = true;
  return;
}

Assistant:

void ShellState::ResetOutput() {
	if (outfile.size() > 1 && outfile[0] == '|') {
#ifndef SQLITE_OMIT_POPEN
		pclose(out);
#endif
	} else {
		output_file_close(out);
#ifndef SQLITE_NOHAVE_SYSTEM
		if (doXdgOpen) {
			const char *zXdgOpenCmd =
#if defined(_WIN32)
			    "start";
#elif defined(__APPLE__)
			    "open";
#else
			    "xdg-open";
#endif
			char *zCmd;
			zCmd = sqlite3_mprintf("%s %s", zXdgOpenCmd, zTempFile);
			if (system(zCmd)) {
				utf8_printf(stderr, "Failed: [%s]\n", zCmd);
			} else {
				/* Give the start/open/xdg-open command some time to get
				** going before we continue, and potential delete the
				** zTempFile data file out from under it */
				sqlite3_sleep(2000);
			}
			sqlite3_free(zCmd);
			PopOutputMode();
			doXdgOpen = 0;
		}
#endif /* !defined(SQLITE_NOHAVE_SYSTEM) */
	}
	outfile = string();
	out = stdout;
	stdout_is_console = true;
}